

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O1

int WOPN_BanksCmp(WOPNFile *bank1,WOPNFile *bank2)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  WOPNBank *pWVar5;
  WOPNBank *pWVar6;
  ulong uVar7;
  
  iVar4 = 0;
  iVar3 = 0;
  if ((((bank1->version == bank2->version) && (iVar3 = iVar4, bank1->lfo_freq == bank2->lfo_freq))
      && (bank1->chip_type == bank2->chip_type)) &&
     (((bank1->volume_model == bank2->volume_model &&
       (bank1->banks_count_melodic == bank2->banks_count_melodic)) &&
      (uVar1 = bank1->banks_count_percussion, uVar1 == bank2->banks_count_percussion)))) {
    uVar7 = (ulong)bank1->banks_count_melodic;
    if (uVar7 != 0) {
      pWVar5 = bank1->banks_melodic;
      pWVar6 = bank2->banks_melodic;
      bVar2 = true;
      do {
        iVar3 = bcmp(pWVar5,pWVar6,0x2424);
        if (iVar3 != 0) {
          bVar2 = false;
        }
        pWVar6 = pWVar6 + 1;
        pWVar5 = pWVar5 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      if (!bVar2) {
        return 0;
      }
    }
    uVar7 = (ulong)uVar1;
    if (uVar7 == 0) {
      iVar3 = 1;
    }
    else {
      pWVar5 = bank1->banks_percussive;
      pWVar6 = bank2->banks_percussive;
      iVar3 = 1;
      do {
        iVar4 = bcmp(pWVar5,pWVar6,0x2424);
        if (iVar4 != 0) {
          iVar3 = 0;
        }
        pWVar6 = pWVar6 + 1;
        pWVar5 = pWVar5 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  return iVar3;
}

Assistant:

int WOPN_BanksCmp(const WOPNFile *bank1, const WOPNFile *bank2)
{
    int res = 1;

    res &= (bank1->version == bank2->version);
    res &= (bank1->lfo_freq == bank2->lfo_freq);
    res &= (bank1->chip_type == bank2->chip_type);
    res &= (bank1->volume_model == bank2->volume_model);
    res &= (bank1->banks_count_melodic == bank2->banks_count_melodic);
    res &= (bank1->banks_count_percussion == bank2->banks_count_percussion);

    if(res)
    {
        int i;
        for(i = 0; i < bank1->banks_count_melodic; i++)
            res &= (memcmp(&bank1->banks_melodic[i], &bank2->banks_melodic[i], sizeof(WOPNBank)) == 0);
        if(res)
        {
            for(i = 0; i < bank1->banks_count_percussion; i++)
                res &= (memcmp(&bank1->banks_percussive[i], &bank2->banks_percussive[i], sizeof(WOPNBank)) == 0);
        }
    }

    return res;
}